

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O0

uint16_t wirehair::GeneratePeelRowWeight(uint32_t rv,uint16_t block_count)

{
  ulong uVar1;
  uint16_t weight;
  uint16_t block_count_local;
  uint32_t rv_local;
  uint16_t local_2;
  
  rv_local = rv;
  if (block_count < 0x801) {
    if (rv < 0x1ffffff) {
      return 1;
    }
    rv_local = rv + 0xfe000001;
  }
  if (rv_local < 0x80000000) {
    local_2 = 2;
  }
  else if (rv_local < 0xaaaaaaaa) {
    local_2 = 3;
  }
  else {
    weight = 3;
    do {
      local_2 = weight + 1;
      uVar1 = (ulong)weight;
      weight = local_2;
    } while (*(uint *)(kPeelCountDistribution + uVar1 * 4) < rv_local);
  }
  return local_2;
}

Assistant:

uint16_t GeneratePeelRowWeight(
    uint32_t rv, ///< 32-bit random value
    uint16_t block_count ///< Number of input blocks
)
{
    // If peel column count is small:
    if (block_count <= kMaxNForWeight1)
    {
        if (rv < P1) {
            return 1;
        }

        // Rescale to match table values
        rv -= P1;
    }

    // Unroll first 3 for speed (common case):

    if (rv <= P2) {
        return 2;
    }

    if (rv <= P3) {
        return 3;
    }

    uint16_t weight = 3;

    // Find first table entry containing a number smaller than or equal to rv
    while (rv > kPeelCountDistribution[weight++])
    {
        CAT_DEBUG_ASSERT(weight < kMaxPeelCount);
    }

    return weight;
}